

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char unaff_retaddr;
  unary_arg_func_ptr op;
  double in_stack_00000018;
  char in_stack_00000027;
  undefined7 in_stack_00000030;
  char in_stack_00000037;
  double in_stack_00000038;
  char in_stack_00000047;
  unary_arg_func_ptr in_stack_00000048;
  char in_stack_00000057;
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  char in_stack_00000077;
  binary_arg_func_ptr in_stack_00000078;
  char in_stack_00000087;
  double in_stack_ffffffffffffffe8;
  double in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff8;
  undefined4 uVar2;
  
  uVar2 = 0;
  test_add(unaff_retaddr,(double)(ulong)in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
           in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_add(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0
           ,in_stack_ffffffffffffffe8);
  test_binary(in_stack_00000087,in_stack_00000078,in_stack_00000077,in_stack_00000068,
              in_stack_00000060,in_stack_00000058);
  test_binary(in_stack_00000087,in_stack_00000078,in_stack_00000077,in_stack_00000068,
              in_stack_00000060,in_stack_00000058);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_mult(unaff_retaddr,(double)CONCAT44(uVar2,in_stack_fffffffffffffff8),
            in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_unary(in_stack_00000057,in_stack_00000048,in_stack_00000047,in_stack_00000038,
             (double)CONCAT17(in_stack_00000037,in_stack_00000030));
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_to_int(in_stack_00000027,in_stack_00000018);
  test_null(in_stack_00000037);
  test_null(in_stack_00000037);
  test_null(in_stack_00000037);
  test_null(in_stack_00000037);
  test_null(in_stack_00000037);
  special_null_test();
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    test_add('T', 0, 0, 0);
    test_add('T', 0, 1, 1);
    test_add('T', 1, 0, 1);
    test_add('T', 1, 1, 0);
    test_add('i', 42, -123, -81);
    test_add('c', 'A', ' ', 'a');
    test_add('h', 4000000000, 4000000000, 8000000000);
    test_add('f', 1.23, -100, -98.77);
    test_add('d', 1.234523452345, -1.111111111111, 0.1234123412341234);

    // avoid division by '0' in test_mult('T', 0, 0, 0):
    test_binary('T', rtosc_arg_val_mult, '*', 0, 0, 0);
    test_binary('T', rtosc_arg_val_mult, '*', 0, 1, 0);
    test_mult('T', 1, 0, 0);
    test_mult('T', 1, 1, 1);
    test_mult('i', -6, -7, 42);
    test_mult('c', '\t', '\a', '?');
    test_mult('h', 3000000000, 2, 6000000000);
    test_mult('f', 0.01, 100, 1);
    test_mult('f', 1000000000000000000, -0.000000000000000001, -1);
    test_mult('d', 0.1111111, 0.1111111, 0.01234567654321);

    unary_arg_func_ptr op = rtosc_arg_val_negate;
    test_unary('T', op, '-', 1, 0);
    test_unary('T', op, '-', 0, 1);
    test_unary('F', op, '-', 1, 0);
    test_unary('F', op, '-', 0, 1);
    test_unary('i', op, '-', 123, -123);
    test_unary('h', op, '-', 8000000000, -8000000000);
    test_unary('f', op, '-', -0.1234, 0.1234);
    test_unary('f', op, '-', 0.0f, 0.0f);
    test_unary('d', op, '-', 0.1234123412341234, -0.1234123412341234);

    op = rtosc_arg_val_round;
    test_unary('T', op, '~', 1, 1);
    test_unary('T', op, '~', 0, 0);
    test_unary('F', op, '~', 1, 1);
    test_unary('F', op, '~', 0, 0);
    test_unary('i', op, '~', 123, 123);
    test_unary('c', op, '~', -123, -123);
    test_unary('h', op, '~', -8000000000, -8000000000);
    test_unary('f', op, '~', -0.1234, 0);
    test_unary('f', op, '~', 9.99f, 9);
    test_unary('f', op, '~', 9.9999f, 10);
    test_unary('d', op, '~', 1234.1234123412341234, 1234);
    test_unary('d', rtosc_arg_val_round, '~', 9999.9999, 10000);

    test_to_int('T', 0);
    test_to_int('T', 1);
    test_to_int('F', 0);
    test_to_int('F', 1);
    test_to_int('i', 42);
    test_to_int('c', ' ');
    test_to_int('h', -80);
    test_to_int('f', .123f);
    test_to_int('d', -.123f);

    test_null('i');
    test_null('c');
    test_null('h');
    test_null('f');
    test_null('d');

    special_null_test();

    // rtosc_arg_val_range_arg is being (indirectly)
    // tested in the pretty-format tests

    return test_summary();
}